

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_scalar.c
# Opt level: O1

int scalar_doclick(t_word *data,t_template *template,t_scalar *sc,_array *ap,_glist *owner,
                  t_float xloc,t_float yloc,int xpix,int ypix,int shift,int alt,int dbl,int doit)

{
  t_gobj *x;
  int iVar1;
  _glist *p_Var2;
  t_symbol *ptVar3;
  _parentwidgetbehavior *p_Var4;
  int iVar5;
  bool bVar6;
  t_float tVar7;
  t_float tVar8;
  float fVar9;
  float fVar10;
  t_atom at [3];
  
  p_Var2 = template_findcanvas(template);
  ptVar3 = gensym("x");
  tVar7 = template_getfloat(template,ptVar3,data,0);
  ptVar3 = gensym("y");
  tVar8 = template_getfloat(template,ptVar3,data,0);
  at[0].a_type = A_FLOAT;
  at[0].a_w.w_float = 0.0;
  at[1].a_type = A_FLOAT;
  fVar10 = tVar7 + xloc;
  at[2].a_type = A_FLOAT;
  fVar9 = tVar8 + yloc;
  at[1].a_w._0_4_ = fVar10;
  at[2].a_w._0_4_ = fVar9;
  if (doit != 0) {
    ptVar3 = gensym("click");
    template_notifyforscalar(template,owner,sc,ptVar3,3,at);
  }
  x = p_Var2->gl_list;
  iVar5 = doit;
  while( true ) {
    if (x == (t_gobj *)0x0) {
      return 0;
    }
    p_Var4 = pd_getparentwidget(&x->g_pd);
    if (p_Var4 == (_parentwidgetbehavior *)0x0) {
      bVar6 = false;
    }
    else {
      iVar1 = (*p_Var4->w_parentclickfn)
                        (x,owner,data,template,sc,ap,fVar10,fVar9,xpix,ypix,shift,alt,dbl,doit);
      bVar6 = iVar1 != 0;
      if (bVar6) {
        iVar5 = iVar1;
      }
    }
    if (bVar6) break;
    x = x->g_next;
  }
  return iVar5;
}

Assistant:

int scalar_doclick(t_word *data, t_template *template, t_scalar *sc,
    t_array *ap, struct _glist *owner,
    t_float xloc, t_float yloc, int xpix, int ypix,
    int shift, int alt, int dbl, int doit)
{
    int hit = 0;
    t_canvas *templatecanvas = template_findcanvas(template);
    t_gobj *y;
    t_atom at[3];
    t_float basex = template_getfloat(template, gensym("x"), data, 0);
    t_float basey = template_getfloat(template, gensym("y"), data, 0);
    SETFLOAT(at, 0); /* unused - this is later bashed to the gpointer */
    SETFLOAT(at+1, basex + xloc);
    SETFLOAT(at+2, basey + yloc);
    if (doit)
        template_notifyforscalar(template, owner,
            sc, gensym("click"), 3, at);
    for (y = templatecanvas->gl_list; y; y = y->g_next)
    {
        const t_parentwidgetbehavior *wb = pd_getparentwidget(&y->g_pd);
        if (!wb) continue;
        if ((hit = (*wb->w_parentclickfn)(y, owner,
            data, template, sc, ap, basex + xloc, basey + yloc,
            xpix, ypix, shift, alt, dbl, doit)))
                return (hit);
    }
    return (0);
}